

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

bool __thiscall cmMessenger::IsMessageTypeVisible(cmMessenger *this,MessageType t)

{
  bool bVar1;
  MessageType t_local;
  cmMessenger *this_local;
  
  if (t == DEPRECATION_ERROR) {
    this_local._7_1_ = GetDeprecatedWarningsAsErrors(this);
  }
  else if (t == DEPRECATION_WARNING) {
    bVar1 = GetSuppressDeprecatedWarnings(this);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else if (t == AUTHOR_ERROR) {
    this_local._7_1_ = GetDevWarningsAsErrors(this);
  }
  else if (t == AUTHOR_WARNING) {
    bVar1 = GetSuppressDevWarnings(this);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMessenger::IsMessageTypeVisible(MessageType t) const
{
  if (t == MessageType::DEPRECATION_ERROR) {
    return this->GetDeprecatedWarningsAsErrors();
  }
  if (t == MessageType::DEPRECATION_WARNING) {
    return !this->GetSuppressDeprecatedWarnings();
  }
  if (t == MessageType::AUTHOR_ERROR) {
    return this->GetDevWarningsAsErrors();
  }
  if (t == MessageType::AUTHOR_WARNING) {
    return !this->GetSuppressDevWarnings();
  }

  return true;
}